

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDataCacheWrapper.cpp
# Opt level: O3

HRESULT __thiscall Js::SimpleDataCacheWrapper::Close(SimpleDataCacheWrapper *this)

{
  return -0x7fffbffb;
}

Assistant:

HRESULT SimpleDataCacheWrapper::Close()
    {
        HRESULT hr = E_FAIL;

#ifdef ENABLE_WININET_PROFILE_DATA_CACHE
        hr = this->SaveWriteStream();

        if (IsReadStreamOpen())
        {
            this->inStream->Release();
            this->inStream = nullptr;
        }

        if (this->dataCache != nullptr)
        {
            this->dataCache->Release();
            this->dataCache = nullptr;
        }
#endif

        return hr;
    }